

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
dap::Deserializer::
deserialize<std::vector<dap::SourceBreakpoint,std::allocator<dap::SourceBreakpoint>>>
          (Deserializer *this,
          optional<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_> *opt
          )

{
  bool bVar1;
  undefined1 local_30 [8];
  vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> v;
  optional<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_> *opt_local;
  Deserializer *this_local;
  
  v.super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)opt;
  std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::vector
            ((vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)local_30);
  bVar1 = deserialize<dap::SourceBreakpoint>
                    (this,(vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)
                          local_30);
  if (bVar1) {
    optional<std::vector<dap::SourceBreakpoint,std::allocator<dap::SourceBreakpoint>>>::operator=
              ((optional<std::vector<dap::SourceBreakpoint,std::allocator<dap::SourceBreakpoint>>> *
               )v.super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)local_30);
  }
  std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::~vector
            ((vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)local_30);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}